

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

iterator __thiscall Character::DelItem(Character *this,iterator it,int amount)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  if (amount < 1) {
    p_Var3 = (it._M_node)->_M_next;
  }
  else {
    iVar2 = *(int *)((long)&it._M_node[1]._M_next + 4);
    if ((iVar2 < 0) || (iVar2 - amount == 0 || iVar2 < amount)) {
      p_Var3 = (it._M_node)->_M_next;
      psVar1 = &(this->inventory).super__List_base<Character_Item,_std::allocator<Character_Item>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(it._M_node,0x18);
    }
    else {
      *(int *)((long)&it._M_node[1]._M_next + 4) = iVar2 - amount;
      p_Var3 = (it._M_node)->_M_next;
    }
    CalculateStats(this,true);
  }
  return (iterator)p_Var3;
}

Assistant:

std::list<Character_Item>::iterator Character::DelItem(std::list<Character_Item>::iterator it, int amount)
{
	if (amount <= 0)
	{
		return ++it;
	}

	if (it->amount < 0 || it->amount - amount <= 0)
	{
		it = this->inventory.erase(it);
	}
	else
	{
		it->amount -= amount;
		++it;
	}

	this->CalculateStats();

	return it;
}